

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

int get_nz_map_ctx(uint8_t *levels,int coeff_idx,int bhl,int width,int scan_idx,int is_eob,
                  TX_SIZE tx_size,TX_CLASS tx_class)

{
  int iVar1;
  byte bVar2;
  int in_ECX;
  int in_EDX;
  long lVar3;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  byte in_stack_00000008;
  char in_stack_00000010;
  int stats;
  int mag;
  int row;
  int col_1;
  int col;
  int ctx;
  uint local_74;
  int local_40;
  int local_3c;
  int local_4;
  
  bVar2 = (byte)in_EDX;
  if (in_R9D == 0) {
    iVar1 = get_padded_idx(in_ESI,in_EDX);
    lVar3 = in_RDI + iVar1;
    iVar1 = (uint)""[*(byte *)(lVar3 + 1)] +
            (uint)""[*(byte *)(lVar3 + ((1 << (bVar2 & 0x1f)) + 4))];
    if (in_stack_00000010 == '\0') {
      local_3c = (uint)""[*(byte *)(lVar3 + 2)] +
                 (uint)""[*(byte *)(lVar3 + ((2 << (bVar2 & 0x1f)) + 8))] +
                 (uint)""[*(byte *)(lVar3 + ((1 << (bVar2 & 0x1f)) + 5))] + iVar1;
    }
    else if (in_stack_00000010 == '\x02') {
      local_3c = (uint)""[*(byte *)(lVar3 + 4)] +
                 (uint)""[*(byte *)(lVar3 + 3)] + (uint)""[*(byte *)(lVar3 + 2)] + iVar1;
    }
    else {
      local_3c = (uint)""[*(byte *)(lVar3 + ((4 << (bVar2 & 0x1f)) + 0x10))] +
                 (uint)""[*(byte *)(lVar3 + ((3 << (bVar2 & 0x1f)) + 0xc))] +
                 (uint)""[*(byte *)(lVar3 + ((2 << (bVar2 & 0x1f)) + 8))] + iVar1;
    }
    if (in_stack_00000010 == '\0' && in_ESI == 0) {
      local_4 = 0;
    }
    else {
      local_74 = local_3c + 1 >> 1;
      if (3 < local_74) {
        local_74 = 4;
      }
      if (in_stack_00000010 == '\0') {
        local_4 = local_74 + (int)av1_nz_map_ctx_offset[in_stack_00000008][in_ESI];
      }
      else if (in_stack_00000010 == '\x01') {
        local_4 = local_74 + nz_map_ctx_offset_1d[in_ESI >> (bVar2 & 0x1f)];
      }
      else if (in_stack_00000010 == '\x02') {
        local_4 = local_74 +
                  nz_map_ctx_offset_1d[in_ESI - ((in_ESI >> (bVar2 & 0x1f)) << (bVar2 & 0x1f))];
      }
      else {
        local_4 = 0;
      }
    }
    local_40 = local_4;
  }
  else if (in_R8D == 0) {
    local_40 = 0;
  }
  else if ((in_ECX << (bVar2 & 0x1f)) / 8 < in_R8D) {
    if ((in_ECX << (bVar2 & 0x1f)) / 4 < in_R8D) {
      local_40 = 3;
    }
    else {
      local_40 = 2;
    }
  }
  else {
    local_40 = 1;
  }
  return local_40;
}

Assistant:

static inline int get_nz_map_ctx(const uint8_t *const levels,
                                 const int coeff_idx, const int bhl,
                                 const int width, const int scan_idx,
                                 const int is_eob, const TX_SIZE tx_size,
                                 const TX_CLASS tx_class) {
  if (is_eob) {
    if (scan_idx == 0) return 0;
    if (scan_idx <= (width << bhl) / 8) return 1;
    if (scan_idx <= (width << bhl) / 4) return 2;
    return 3;
  }
  const int stats =
      get_nz_mag(levels + get_padded_idx(coeff_idx, bhl), bhl, tx_class);
  return get_nz_map_ctx_from_stats(stats, coeff_idx, bhl, tx_size, tx_class);
}